

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_LDD(void)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  Z80Reg ZVar4;
  EBracketType EVar5;
  int iVar6;
  Z80Reg ZVar7;
  ulong uVar8;
  Z80Reg reg;
  Z80Reg reg2;
  int e [8];
  
  bVar1 = Options::noFakes(false);
  if (bVar1) {
    EmitByte(0xed,true);
    EmitByte(0xa8,false);
  }
  else {
    do {
      e[2] = -1;
      e[3] = -1;
      e[4] = -1;
      e[5] = -1;
      reg = Z80_UNK;
      reg2 = Z80_UNK;
      e[0] = -1;
      e[1] = -1;
      ZVar4 = GetRegister(&::lp);
      if ((uint)ZVar4 < 6) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar7 = GetRegister(&::lp);
          if (ZVar7 == Z80_MEM_HL) {
            Options::noFakes(true);
            reg2 = ~Z80_C;
            e[0] = 0x2b;
            reg = ZVar4 * 8 + (Z80_SP|Z80_MEM_HL);
          }
          else if ((ZVar7 == Z80_MEM_IX) || (ZVar7 == Z80_MEM_IY)) {
            Options::noFakes(true);
            e[1] = -2;
            e[0] = GetRegister_lastIxyD;
            e[3] = 0x2b;
            e[2] = ZVar7 & 0xff;
            reg = ZVar7 & 0xff;
            reg2 = ZVar4 * 8 + (Z80_SP|Z80_MEM_HL);
          }
        }
      }
      else if (ZVar4 == Z80_MEM_HL) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar4 = GetRegister(&::lp);
          if (ZVar4 == Z80_UNK) {
            Options::noFakes(true);
            _reg = CONCAT44(reg2,0x36);
            bVar2 = GetByteNoMem(&::lp,false);
            e[0] = -2;
            e[1] = 0x2b;
            reg2 = (uint)bVar2;
          }
          else if (((uint)ZVar4 < 6) || (ZVar4 == Z80_A)) {
            Options::noFakes(true);
            reg2 = ~Z80_C;
            e[0] = 0x2b;
            reg = ZVar4 + (Z80_SP|Z80_HL);
          }
        }
      }
      else if (ZVar4 == Z80_A) {
        bVar1 = comma(&::lp);
        if ((bVar1) && (EVar5 = OpenBracket(&::lp), EVar5 != BT_NONE)) {
          Options::noFakes(true);
          ZVar4 = GetRegister(&::lp);
          if ((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) {
            iVar6 = CloseBracket(&::lp);
            if (iVar6 != 0) {
              reg = ZVar4 + ~Z80_L;
            }
            reg2 = ~Z80_C;
            e[0] = ZVar4 + ~Z80_H;
          }
          else if (ZVar4 == Z80_HL) {
            iVar6 = CloseBracket(&::lp);
            if (iVar6 != 0) {
              reg = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
            }
            reg2 = ~Z80_C;
            e[0] = 0x2b;
          }
          else if ((ZVar4 == Z80_IX) || (ZVar4 == Z80_IY)) {
            reg2 = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
            bVar2 = z80GetIDxoffset(&::lp);
            e[1] = -2;
            e[0] = (uint)bVar2;
            e[3] = 0x2b;
            iVar6 = CloseBracket(&::lp);
            if (iVar6 != 0) {
              e[2] = ZVar4;
              reg = ZVar4;
            }
          }
        }
      }
      else if ((ZVar4 == Z80_MEM_IX) || (ZVar4 == Z80_MEM_IY)) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar7 = GetRegister(&::lp);
          if (ZVar7 == Z80_UNK) {
            Options::noFakes(true);
            reg = ZVar4 & 0xff;
            e._8_8_ = CONCAT44(ZVar4,e[2]) & 0xffffffffff;
            reg2 = Z80_HL|Z80_MEM_HL;
            e[0] = GetRegister_lastIxyD;
            bVar3 = GetByteNoMem(&::lp,false);
            e[1]._0_1_ = bVar3;
            e[1]._1_3_ = 0;
            e[2] = -2;
            e[4] = 0x2b;
          }
          else if (((uint)ZVar7 < 6) || (ZVar7 == Z80_A)) {
            Options::noFakes(true);
            e[2] = ZVar4 & 0xff;
            reg2 = ZVar7 + (Z80_SP|Z80_HL);
            e[1] = -2;
            e[0] = GetRegister_lastIxyD;
            e[3] = 0x2b;
            reg = e[2];
          }
        }
      }
      else {
        EVar5 = OpenBracket(&::lp);
        if (EVar5 == BT_NONE) {
          reg = 0xed;
          reg2 = 0xa8;
        }
        else {
          ZVar4 = GetRegister(&::lp);
          iVar6 = CloseBracket(&::lp);
          if ((((iVar6 != 0) && (bVar1 = comma(&::lp), bVar1)) &&
              ((ZVar4 == Z80_BC || (ZVar4 == Z80_DE)))) &&
             (ZVar7 = GetRegister(&::lp), ZVar7 == Z80_A)) {
            Options::noFakes(true);
            reg = ZVar4 + ~(Z80_I|Z80_L);
            reg2 = ~Z80_C;
            e[0] = ZVar4 + ~Z80_H;
          }
        }
      }
      EmitBytes(&reg,true);
      uVar8 = (*DAT_001e16b0)(&::lp);
    } while ((uVar8 & 1) != 0);
  }
  return;
}

Assistant:

static void OpCode_LDD() {
		if (Options::noFakes(false)) {
			EmitByte(0xED, true);
			EmitByte(0xA8);
			return;
		}

		// only when fakes are enabled (but they may be silent/warning enabled, so extra checks needed)
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1 };
			Z80Reg reg2 = Z80_UNK, reg = GetRegister(lp);
			switch (reg) {
			case Z80_A:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg = GetRegister(lp)) {
				case Z80_BC:	// 0x0A 0x0B
				case Z80_DE:	// 0x1A 0x1B
					if (CloseBracket(lp)) e[0] = reg-6;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg-5;
					break;
				case Z80_HL:	// 0x7E	0x2B
					if (CloseBracket(lp)) e[0] = 0x7e;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_IX: case Z80_IY:
					e[1] = 0x7e; e[2] = z80GetIDxoffset(lp);
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					if (CloseBracket(lp)) e[0] = e[4] = reg;
					break;
				default:
					break;
				}
				break;
			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x46 + reg * 8;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[4] = reg2&0xFF;
					e[1] = 0x46 + reg * 8;
					e[2] = GetRegister_lastIxyD;
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_HL:
				if (!comma(lp)) break;
				switch (reg = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x70 + reg;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x2b;
					break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = 0x36; e[1] = GetByteNoMem(lp);
					e[2] = INSTRUCTION_START_MARKER;
					e[3] = 0x2b;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_IX: case Z80_MEM_IY:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[4] = reg&0xFF;
					e[2] = GetRegister_lastIxyD;
					e[1] = 0x70 + reg2;
					e[3] = INSTRUCTION_START_MARKER;
					e[5] = 0x2b;
					break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[5] = reg&0xFF;
					e[1] = 0x36;
					e[2] = GetRegister_lastIxyD;
					e[3] = GetByteNoMem(lp);
					e[4] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				default:
					break;
				}
				break;
			default:
				if (BT_NONE != OpenBracket(lp)) {
					reg = GetRegister(lp);
					if (!CloseBracket(lp) || !comma(lp)) break;
					if ((Z80_BC != reg && Z80_DE != reg) || Z80_A != GetRegister(lp)) break;
					Options::noFakes();		// to display warning if "-f"
					e[0] = reg - 14;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg - 5;	// LDD (bc|de),a
				} else {
					e[0] = 0xed; e[1] = 0xa8;			// regular LDD
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}